

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector.h
# Opt level: O1

void * __thiscall vector<int>::realloc(vector<int> *this,void *__ptr,size_t __size)

{
  int *piVar1;
  void *in_RAX;
  int *__s;
  void *extraout_RAX;
  void *pvVar2;
  uint uVar3;
  
  uVar3 = 1;
  if (1 < (int)(uint)__ptr) {
    uVar3 = (uint)__ptr;
  }
  if (this->_capacity != uVar3) {
    __s = (int *)operator_new__((ulong)uVar3 << 2);
    memset(__s,0,(ulong)uVar3 << 2);
    in_RAX = (void *)(long)this->_size;
    if (0 < (long)in_RAX) {
      piVar1 = this->vect;
      pvVar2 = (void *)0x0;
      do {
        __s[(long)pvVar2] = piVar1[(long)pvVar2];
        pvVar2 = (void *)((long)pvVar2 + 1);
      } while (in_RAX != pvVar2);
    }
    this->_capacity = uVar3;
    if (this->vect != (int *)0x0) {
      operator_delete__(this->vect);
      in_RAX = extraout_RAX;
    }
    this->vect = __s;
  }
  return in_RAX;
}

Assistant:

inline T max(const T& a, const T& b) {
    return (a < b) ? b : a;
}